

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::BufferTestUtil::VertexArrayVerifier::VertexArrayVerifier
          (VertexArrayVerifier *this,Context *context)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  ShaderProgram *pSVar5;
  RenderContext *pRVar6;
  TestContext *this_00;
  TestLog *log;
  TestError *this_01;
  undefined4 extraout_var;
  Functions *funcs;
  string local_140;
  allocator<char> local_119;
  string local_118;
  ProgramSources local_f8;
  Context *local_18;
  Context *context_local;
  VertexArrayVerifier *this_local;
  
  local_18 = context;
  context_local = (Context *)this;
  BufferVerifierBase::BufferVerifierBase(&this->super_BufferVerifierBase,context);
  (this->super_BufferVerifierBase)._vptr_BufferVerifierBase =
       (_func_int **)&PTR__VertexArrayVerifier_00cb5530;
  this->m_program = (ShaderProgram *)0x0;
  this->m_posLoc = 0;
  this->m_byteVecLoc = 0;
  pSVar5 = (ShaderProgram *)operator_new(0xd0);
  funcs._6_1_ = 1;
  pRVar6 = Context::getRenderContext((this->super_BufferVerifierBase).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "attribute highp vec2 a_position;\nattribute mediump vec3 a_byteVec;\nvarying mediump vec3 v_byteVec;\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tv_byteVec = a_byteVec;\n}\n"
             ,&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,
             "varying mediump vec3 v_byteVec;\nvoid main (void)\n{\n\tgl_FragColor = vec4(v_byteVec, 1.0);\n}\n"
             ,(allocator<char> *)((long)&funcs + 7));
  glu::makeVtxFragSources(&local_f8,&local_118,&local_140);
  glu::ShaderProgram::ShaderProgram(pSVar5,pRVar6,&local_f8);
  funcs._6_1_ = 0;
  this->m_program = pSVar5;
  glu::ProgramSources::~ProgramSources(&local_f8);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&funcs + 7));
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  bVar2 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar2) {
    this_00 = Context::getTestContext((this->super_BufferVerifierBase).m_context);
    log = tcu::TestContext::getLog(this_00);
    glu::operator<<(log,this->m_program);
    pSVar5 = this->m_program;
    if (pSVar5 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar5);
      operator_delete(pSVar5,0xd0);
    }
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBufferTestUtil.cpp"
               ,0x12e);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pRVar6 = Context::getRenderContext(local_18);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar3) + 0x780);
  dVar4 = glu::ShaderProgram::getProgram(this->m_program);
  dVar4 = (*pcVar1)(dVar4,"a_position");
  this->m_posLoc = dVar4;
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar3) + 0x780);
  dVar4 = glu::ShaderProgram::getProgram(this->m_program);
  dVar4 = (*pcVar1)(dVar4,"a_byteVec");
  this->m_byteVecLoc = dVar4;
  return;
}

Assistant:

VertexArrayVerifier::VertexArrayVerifier (Context& context)
	: BufferVerifierBase	(context)
	, m_program				(DE_NULL)
	, m_posLoc				(0)
	, m_byteVecLoc			(0)
{
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(
		"attribute highp vec2 a_position;\n"
		"attribute mediump vec3 a_byteVec;\n"
		"varying mediump vec3 v_byteVec;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
		"	v_byteVec = a_byteVec;\n"
		"}\n",

		"varying mediump vec3 v_byteVec;\n"
		"void main (void)\n"
		"{\n"
		"	gl_FragColor = vec4(v_byteVec, 1.0);\n"
		"}\n"));

	if (!m_program->isOk())
	{
		m_context.getTestContext().getLog() << *m_program;
		delete m_program;
		TCU_FAIL("Compile failed");
	}

	const glw::Functions& funcs = context.getRenderContext().getFunctions();
	m_posLoc		= funcs.getAttribLocation(m_program->getProgram(), "a_position");
	m_byteVecLoc	= funcs.getAttribLocation(m_program->getProgram(), "a_byteVec");
}